

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_double(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            double val,semantic_tag tag,ser_context *param_4,error_code *param_5)

{
  back_insert_iterator<jsoncons::binary_stream_sink> bVar1;
  uint64_t in_RCX;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_RDX;
  uchar in_SIL;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_XMM0_Qa;
  float valf;
  binary_stream_sink *in_stack_ffffffffffffff88;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_ffffffffffffff90
  ;
  back_insert_iterator<jsoncons::binary_stream_sink> in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  float val_00;
  back_insert_iterator<jsoncons::binary_stream_sink> in_stack_ffffffffffffffc0;
  undefined8 local_10;
  
  val_00 = (float)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_10 = in_XMM0_Qa;
  if (in_SIL == '\x05') {
    write_tag(in_RDX,in_RCX);
  }
  else if (in_SIL == '\x06') {
    write_tag(in_RDX,in_RCX);
    if (((double)in_XMM0_Qa != 0.0) || (NAN((double)in_XMM0_Qa))) {
      local_10 = (basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                 ((double)in_XMM0_Qa / 1000.0);
    }
  }
  else if (in_SIL == '\a') {
    write_tag(in_RDX,in_RCX);
    if (((double)in_XMM0_Qa != 0.0) || (NAN((double)in_XMM0_Qa))) {
      local_10 = (basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                 ((double)in_XMM0_Qa / 1000000000.0);
    }
  }
  if (((double)(float)(double)local_10 != (double)local_10) ||
     (NAN((double)(float)(double)local_10) || NAN((double)local_10))) {
    bVar1 = std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff88);
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (in_SIL,in_stack_ffffffffffffffb0);
    std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff88);
    binary::
    native_to_big<double,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              ((double)bVar1.container,in_stack_ffffffffffffffc0);
  }
  else {
    std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff88);
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (in_SIL,in_stack_ffffffffffffffb0);
    bVar1 = std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff88);
    binary::
    native_to_big<float,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (val_00,bVar1);
    local_10 = in_stack_ffffffffffffff90;
  }
  end_value(local_10);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_double(double val, 
                      semantic_tag tag,
                      const ser_context&,
                      std::error_code&) override
    {
        switch (tag)
        {
            case semantic_tag::epoch_second:
                write_tag(1);
                break;
            case semantic_tag::epoch_milli:
                write_tag(1);
                if (val != 0)
                {
                    val /= millis_in_second;
                }
                break;
            case semantic_tag::epoch_nano:
                write_tag(1);
                if (val != 0)
                {
                    val /= nanos_in_second;
                }
                break;
            default:
                break;
        }

        float valf = (float)val;
        if ((double)valf == val)
        {
            binary::native_to_big(static_cast<uint8_t>(0xfa), 
                                  std::back_inserter(sink_));
            binary::native_to_big(valf, std::back_inserter(sink_));
        }
        else
        {
            binary::native_to_big(static_cast<uint8_t>(0xfb), 
                                  std::back_inserter(sink_));
            binary::native_to_big(val, std::back_inserter(sink_));
        }

        // write double

        end_value();
        JSONCONS_VISITOR_RETURN;
    }